

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

Gia_Man_t * Cec_ManLSCorrespondence(Gia_Man_t *pAig,Cec_ParCor_t *pPars)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  int iVar5;
  uint *pInitState;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  size_t sVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  
  if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
    free(pAig->pReprs);
    pAig->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (pAig->pNexts != (int *)0x0) {
    free(pAig->pNexts);
    pAig->pNexts = (int *)0x0;
  }
  if (pPars->nPrefix == 0) {
    iVar5 = Cec_ManLSCorrespondenceClasses(pAig,pPars);
    if (iVar5 == 0) {
      pGVar6 = Gia_ManDup(pAig);
      return pGVar6;
    }
  }
  else {
    pInitState = Cec_ManComputeInitState(pAig,pPars->nPrefix);
    pGVar6 = Gia_ManDupFlip(pAig,(int *)pInitState);
    if (pInitState != (uint *)0x0) {
      free(pInitState);
    }
    Cec_ManLSCorrespondenceClasses(pGVar6,pPars);
    pAig->pReprs = pGVar6->pReprs;
    pGVar6->pReprs = (Gia_Rpr_t *)0x0;
    pAig->pNexts = pGVar6->pNexts;
    pGVar6->pNexts = (int *)0x0;
    pPars->fUseCSat = 0;
    iVar5 = 1000;
    if (1000 < pPars->nBTLimit) {
      iVar5 = pPars->nBTLimit;
    }
    pPars->nBTLimit = iVar5;
    Cec_ManLSCorrespondenceBmc(pAig,pPars,pPars->nPrefix);
    Gia_ManStop(pGVar6);
  }
  if (pPars->fMakeChoices == 0) {
    pGVar7 = Gia_ManCorrReduce(pAig);
    pGVar6 = Gia_ManSeqCleanup(pGVar7);
    Gia_ManStop(pGVar7);
    iVar5 = (int)pGVar7;
  }
  else {
    pGVar7 = pAig;
    pGVar6 = Gia_ManEquivToChoices(pAig,1);
    iVar5 = (int)pGVar7;
  }
  if (pPars->fVerbose != 0) {
    iVar12 = ~(pAig->vCos->nSize + pAig->vCis->nSize) + pAig->nObjs;
    dVar16 = 1.0;
    dVar15 = 1.0;
    if (iVar12 != 0) {
      dVar15 = (double)iVar12;
    }
    iVar1 = pAig->nRegs;
    if (iVar1 != 0) {
      dVar16 = (double)iVar1;
    }
    Abc_Print(iVar5,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,((double)(iVar12 - (~(pGVar6->vCos->nSize + pGVar6->vCis->nSize) + pGVar6->nObjs)) *
               100.0) / dVar15,((double)(iVar1 - pGVar6->nRegs) * 100.0) / dVar16);
  }
  if ((pPars->nPrefix != 0) &&
     (((pAig->vCis->nSize - pAig->nObjs) + pAig->vCos->nSize <
       (pGVar6->vCis->nSize - pGVar6->nObjs) + pGVar6->vCos->nSize || (pGVar6->nRegs < pAig->nRegs))
     )) {
    Abc_Print(iVar5,"The reduced AIG was produced using %d-th invariants and will not verify.\n");
  }
  if (pPars->fVerboseFlops != 0) {
    if (pAig->vNamesIn == (Vec_Ptr_t *)0x0) {
      Abc_Print(iVar5,"Flop output names are not available. Use command \"&get -n\".\n");
    }
    else {
      Cec_ManPrintFlopEquivs(pAig);
    }
  }
  pVVar3 = pAig->vNamesIn;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = pVVar3->nSize;
    pVVar8->nSize = iVar5;
    iVar12 = pVVar3->nCap;
    pVVar8->nCap = iVar12;
    if ((long)iVar12 == 0) {
      ppvVar9 = (void **)0x0;
    }
    else {
      ppvVar9 = (void **)malloc((long)iVar12 << 3);
    }
    pVVar8->pArray = ppvVar9;
    memcpy(ppvVar9,pVVar3->pArray,(long)iVar5 * 8);
    if (0 < iVar5) {
      lVar13 = 0;
      do {
        pcVar4 = (char *)ppvVar9[lVar13];
        if (pcVar4 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          sVar10 = strlen(pcVar4);
          pcVar11 = (char *)malloc(sVar10 + 1);
          strcpy(pcVar11,pcVar4);
        }
        ppvVar9[lVar13] = pcVar11;
        lVar13 = lVar13 + 1;
      } while (iVar5 != lVar13);
    }
    pGVar6->vNamesIn = pVVar8;
    uVar2 = pGVar6->vCis->nSize;
    uVar14 = (ulong)uVar2;
    iVar5 = pVVar8->nSize;
    if ((int)uVar2 < iVar5) {
      do {
        if ((int)uVar2 < 0) goto LAB_00649893;
        if (pVVar8->pArray[uVar14] != (void *)0x0) {
          free(pVVar8->pArray[uVar14]);
        }
        uVar14 = uVar14 + 1;
        pVVar8 = pGVar6->vNamesIn;
        iVar5 = pVVar8->nSize;
      } while ((int)uVar14 < iVar5);
    }
    iVar12 = pGVar6->vCis->nSize;
    if (iVar5 < iVar12) goto LAB_006498b2;
    pVVar8->nSize = iVar12;
  }
  pVVar3 = pAig->vNamesOut;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = pVVar3->nSize;
    pVVar8->nSize = iVar5;
    iVar12 = pVVar3->nCap;
    pVVar8->nCap = iVar12;
    if ((long)iVar12 == 0) {
      ppvVar9 = (void **)0x0;
    }
    else {
      ppvVar9 = (void **)malloc((long)iVar12 << 3);
    }
    pVVar8->pArray = ppvVar9;
    memcpy(ppvVar9,pVVar3->pArray,(long)iVar5 * 8);
    if (0 < iVar5) {
      lVar13 = 0;
      do {
        pcVar4 = (char *)ppvVar9[lVar13];
        if (pcVar4 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          sVar10 = strlen(pcVar4);
          pcVar11 = (char *)malloc(sVar10 + 1);
          strcpy(pcVar11,pcVar4);
        }
        ppvVar9[lVar13] = pcVar11;
        lVar13 = lVar13 + 1;
      } while (iVar5 != lVar13);
    }
    pGVar6->vNamesOut = pVVar8;
    uVar2 = pGVar6->vCos->nSize;
    uVar14 = (ulong)uVar2;
    iVar5 = pVVar8->nSize;
    if ((int)uVar2 < iVar5) {
      do {
        if ((int)uVar2 < 0) {
LAB_00649893:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (pVVar8->pArray[uVar14] != (void *)0x0) {
          free(pVVar8->pArray[uVar14]);
        }
        uVar14 = uVar14 + 1;
        pVVar8 = pGVar6->vNamesOut;
        iVar5 = pVVar8->nSize;
      } while ((int)uVar14 < iVar5);
    }
    iVar12 = pGVar6->vCos->nSize;
    if (iVar5 < iVar12) {
LAB_006498b2:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    pVVar8->nSize = iVar12;
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Cec_ManLSCorrespondence( Gia_Man_t * pAig, Cec_ParCor_t * pPars )
{  
    Gia_Man_t * pNew, * pTemp;
    unsigned * pInitState;
    int RetValue;
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    if ( pPars->nPrefix == 0 )
    {
        RetValue = Cec_ManLSCorrespondenceClasses( pAig, pPars );
        if ( RetValue == 0 )
            return Gia_ManDup( pAig );
    }
    else
    {
        // compute the cycles AIG
        pInitState = Cec_ManComputeInitState( pAig, pPars->nPrefix );
        pTemp = Gia_ManDupFlip( pAig, (int *)pInitState );
        ABC_FREE( pInitState );
        // compute classes of this AIG
        RetValue = Cec_ManLSCorrespondenceClasses( pTemp, pPars );
        // transfer the class info
        pAig->pReprs = pTemp->pReprs; pTemp->pReprs = NULL;
        pAig->pNexts = pTemp->pNexts; pTemp->pNexts = NULL;
        // perform additional BMC
        pPars->fUseCSat = 0;
        pPars->nBTLimit = Abc_MaxInt( pPars->nBTLimit, 1000 );
        Cec_ManLSCorrespondenceBmc( pAig, pPars, pPars->nPrefix );
/*
        // transfer the class info back
        pTemp->pReprs = pAig->pReprs; pAig->pReprs = NULL;
        pTemp->pNexts = pAig->pNexts; pAig->pNexts = NULL;
        // continue refining
        RetValue = Cec_ManLSCorrespondenceClasses( pTemp, pPars );
        // transfer the class info
        pAig->pReprs = pTemp->pReprs; pTemp->pReprs = NULL;
        pAig->pNexts = pTemp->pNexts; pTemp->pNexts = NULL;
*/
        Gia_ManStop( pTemp );
    }
    // derive reduced AIG
    if ( pPars->fMakeChoices )
    {
        pNew = Gia_ManEquivToChoices( pAig, 1 );
//        Gia_ManHasChoices_very_old( pNew );
    }
    else
    {
//        Gia_ManEquivImprove( pAig );
        pNew = Gia_ManCorrReduce( pAig );
        pNew = Gia_ManSeqCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
        //Gia_AigerWrite( pNew, "reduced.aig", 0, 0, 0 );
    }
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(pNew), 
            100.0*(Gia_ManAndNum(pAig)-Gia_ManAndNum(pNew))/(Gia_ManAndNum(pAig)?Gia_ManAndNum(pAig):1), 
            Gia_ManRegNum(pAig), Gia_ManRegNum(pNew), 
            100.0*(Gia_ManRegNum(pAig)-Gia_ManRegNum(pNew))/(Gia_ManRegNum(pAig)?Gia_ManRegNum(pAig):1) );
    }
    if ( pPars->nPrefix && (Gia_ManAndNum(pNew) < Gia_ManAndNum(pAig) || Gia_ManRegNum(pNew) < Gia_ManRegNum(pAig)) )
        Abc_Print( 1, "The reduced AIG was produced using %d-th invariants and will not verify.\n", pPars->nPrefix );
    // print verbose info about equivalences
    if ( pPars->fVerboseFlops )
    {
        if ( pAig->vNamesIn == NULL )
            Abc_Print( 1, "Flop output names are not available. Use command \"&get -n\".\n" );
        else
            Cec_ManPrintFlopEquivs( pAig );
    }
    // copy names if present
    if ( pAig->vNamesIn )
    {
        char * pName; int i;
        pNew->vNamesIn = Vec_PtrDupStr( pAig->vNamesIn );
        Vec_PtrForEachEntryStart( char *, pNew->vNamesIn, pName, i, Gia_ManCiNum(pNew) )
            ABC_FREE( pName );
        Vec_PtrShrink( pNew->vNamesIn, Gia_ManCiNum(pNew) );
    }
    if ( pAig->vNamesOut )
    {
        char * pName; int i;
        pNew->vNamesOut = Vec_PtrDupStr( pAig->vNamesOut );
        Vec_PtrForEachEntryStart( char *, pNew->vNamesOut, pName, i, Gia_ManCoNum(pNew) )
            ABC_FREE( pName );
        Vec_PtrShrink( pNew->vNamesOut, Gia_ManCoNum(pNew) );
    }
    return pNew;
}